

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsThermalEngine.cpp
# Opt level: O1

void __thiscall
chrono::ChShaftsThermalEngine::ChShaftsThermalEngine
          (ChShaftsThermalEngine *this,ChShaftsThermalEngine *other)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  int iVar2;
  undefined4 extraout_var;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  ChShaftsTorqueBase::ChShaftsTorqueBase
            (&this->super_ChShaftsTorqueBase,&other->super_ChShaftsTorqueBase);
  (this->super_ChShaftsTorqueBase).super_ChShaftsCouple.super_ChPhysicsItem.super_ChObj._vptr_ChObj
       = (_func_int **)&PTR__ChShaftsThermalEngine_00b4cb00;
  (this->Tw).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->Tw).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->throttle = other->throttle;
  this->error_backward = other->error_backward;
  iVar2 = (*((other->Tw).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->_vptr_ChFunction[2])();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChFunction*>
            (a_Stack_20,(ChFunction *)CONCAT44(extraout_var,iVar2));
  _Var1._M_pi = a_Stack_20[0]._M_pi;
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->Tw).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->Tw).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (ChFunction *)CONCAT44(extraout_var,iVar2);
  (this->Tw).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (a_Stack_20[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_20[0]._M_pi);
  }
  return;
}

Assistant:

ChShaftsThermalEngine::ChShaftsThermalEngine(const ChShaftsThermalEngine& other) : ChShaftsTorqueBase(other) {
    throttle = other.throttle;
    error_backward = other.error_backward;
    Tw = std::shared_ptr<ChFunction>(other.Tw->Clone());  // deep copy
}